

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O0

bool cmExportCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  size_type sVar5;
  const_reference pvVar6;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  *this;
  cmArgumentParser<Arguments> *pcVar7;
  cmMakefile *pcVar8;
  reference __rhs;
  ulong uVar9;
  cmGlobalGenerator *this_00;
  pointer ppVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  reference name;
  ostream *poVar11;
  cmExportBuildFileGenerator *pcVar12;
  pointer pcVar13;
  char *mainFile;
  PolicyID id;
  static_string_view sVar14;
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> local_e30
  ;
  string *local_e28;
  string *ct;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> local_dd0
  ;
  unique_ptr<cmExportBuildAndroidMKGenerator,_std::default_delete<cmExportBuildAndroidMKGenerator>_>
  local_dc8;
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> local_dc0
  ;
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> ebfg;
  cmAlphaNum local_d88;
  string local_d58;
  cmAlphaNum local_d38;
  string local_d08;
  cmAlphaNum local_ce8;
  string local_cb8;
  allocator<char> local_c91;
  string local_c90;
  cmExportBuildFileGenerator *local_c70;
  cmExportBuildFileGenerator *ebfg_1;
  undefined1 local_c48 [8];
  ostringstream e_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  cmTarget *local_a90;
  cmTarget *target;
  undefined1 local_a68 [8];
  ostringstream e_3;
  string *currentTarget;
  const_iterator __end3;
  const_iterator __begin3;
  MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range3;
  undefined1 local_8b0 [8];
  ostringstream e_2;
  _Self local_738;
  _Self local_730;
  iterator it;
  cmExportSetMap *setMap;
  cmExportSet *exportSet;
  cmGlobalGenerator *gg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  string *local_6b8;
  string *dir;
  undefined1 local_690 [8];
  ostringstream e_1;
  cmMakefile *mf;
  undefined1 local_4f0 [8];
  ostringstream e;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  allocator<char> local_331;
  string local_330;
  byte local_309;
  undefined1 local_308 [7];
  bool android;
  string fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 local_2a0 [8];
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  bool supportCxx20FileSetTypes;
  cmArgumentParser<Arguments> local_138;
  undefined1 local_c8 [8];
  cmArgumentParser<Arguments> parser;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = local_20;
  if (sVar5 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with too few arguments",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
    goto LAB_0039f10e;
  }
  pvVar6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  bVar2 = std::operator==(pvVar6,"PACKAGE");
  if (bVar2) {
    args_local._7_1_ =
         HandlePackage((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local,local_20);
    goto LAB_0039f10e;
  }
  local_138.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
  local_138.super_Base.Bindings.Positions.
  super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  .
  super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
  local_138.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
  local_138.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
  local_138.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  local_138.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
  local_138.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
       (_Manager_type)0x0;
  local_138.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  local_138.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super_Base.Bindings.Keywords.
  super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  .
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmArgumentParser<Arguments>::cmArgumentParser(&local_138);
  sVar14 = cm::operator____s("NAMESPACE",9);
  this = (cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
          *)cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
            ::Bind<std::__cxx11::string>
                      ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                        *)&local_138,sVar14,0x40);
  sVar14 = cm::operator____s("FILE",4);
  pcVar7 = cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
           ::Bind<std::__cxx11::string>(this,sVar14,0x60);
  cmArgumentParser<Arguments>::cmArgumentParser((cmArgumentParser<Arguments> *)local_c8,pcVar7);
  cmArgumentParser<Arguments>::~cmArgumentParser(&local_138);
  pcVar8 = cmExecutionStatus::GetMakefile(local_20);
  bVar2 = cmExperimental::HasSupportEnabled(pcVar8,CxxModuleCMakeApi);
  if (bVar2) {
    sVar14 = cm::operator____s("CXX_MODULES_DIRECTORY",0x15);
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_c8,sVar14,0xa0);
  }
  pvVar6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  bVar2 = std::operator==(pvVar6,"EXPORT");
  if (bVar2) {
    sVar14 = cm::operator____s("EXPORT",6);
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_c8,sVar14,0);
  }
  else {
    sVar14 = cm::operator____s("TARGETS",7);
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<std::optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_c8,sVar14,0x20);
    sVar14 = cm::operator____s("ANDROID_MK",10);
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_c8,sVar14,0x80);
    sVar14 = cm::operator____s("APPEND",6);
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_c8,sVar14,0xc0);
    sVar14 = cm::operator____s("EXPORT_LINK_INTERFACE_LIBRARIES",0x1f);
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_c8,sVar14,0xc1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&arguments.Append);
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Arguments *)local_2a0,
             (cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)local_c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)status_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&arguments.Append,0);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&arguments.Append);
  pcVar1 = local_20;
  if (bVar2) {
    std::__cxx11::string::string((string *)local_308);
    local_309 = 0;
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)local_308,(string *)(arguments.Filename.field_2._M_local_buf + 8));
      local_309 = 1;
    }
    uVar9 = std::__cxx11::string::empty();
    if (((uVar9 & 1) == 0) || (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) == 0)) {
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) != 0) {
        cmsys::SystemTools::GetFilenameLastExtension
                  (&local_378,(string *)((long)&arguments.Namespace.field_2 + 8));
        bVar2 = std::operator!=(&local_378,".cmake");
        std::__cxx11::string::~string((string *)&local_378);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f0);
          poVar11 = std::operator<<((ostream *)local_4f0,"FILE option given filename \"");
          poVar11 = std::operator<<(poVar11,(string *)(arguments.Namespace.field_2._M_local_buf + 8)
                                   );
          std::operator<<(poVar11,"\" which does not have an extension of \".cmake\".\n");
          pcVar1 = local_20;
          std::__cxx11::ostringstream::str();
          cmExecutionStatus::SetError(pcVar1,(string *)&mf);
          std::__cxx11::string::~string((string *)&mf);
          args_local._7_1_ = 0;
          fname.field_2._12_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f0);
          goto LAB_0039f0a6;
        }
        std::__cxx11::string::operator=
                  ((string *)local_308,(string *)(arguments.Namespace.field_2._M_local_buf + 8));
      }
LAB_0039e20c:
      pcVar8 = cmExecutionStatus::GetMakefile(local_20);
      bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_308);
      if (bVar2) {
        bVar2 = cmMakefile::CanIWriteThisFile(pcVar8,(string *)local_308);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_690);
          poVar11 = std::operator<<((ostream *)local_690,"FILE option given filename \"");
          poVar11 = std::operator<<(poVar11,(string *)local_308);
          std::operator<<(poVar11,"\" which is in the source tree.\n");
          pcVar1 = local_20;
          std::__cxx11::ostringstream::str();
          cmExecutionStatus::SetError(pcVar1,(string *)&dir);
          std::__cxx11::string::~string((string *)&dir);
          args_local._7_1_ = 0;
          fname.field_2._12_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_690);
          goto LAB_0039f0a6;
        }
      }
      else {
        local_6b8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &targets.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_6b8,"/");
        std::operator+(&local_6d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &targets.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_308);
        std::__cxx11::string::operator=((string *)local_308,(string *)&local_6d8);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::__cxx11::string::~string
                  ((string *)
                   &targets.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&gg);
      this_00 = cmMakefile::GetGlobalGenerator(pcVar8);
      setMap = (cmExportSetMap *)0x0;
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,0);
      bVar2 = std::operator==(pvVar6,"EXPORT");
      if (bVar2) {
        it._M_node = (_Base_ptr)cmGlobalGenerator::GetExportSets(this_00);
        local_730._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                     *)it._M_node,(key_type *)local_2a0);
        local_738._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
             ::end(it._M_node);
        bVar2 = std::operator==(&local_730,&local_738);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8b0);
          poVar11 = std::operator<<((ostream *)local_8b0,"Export set \"");
          poVar11 = std::operator<<(poVar11,(string *)local_2a0);
          std::operator<<(poVar11,"\" not found.");
          pcVar1 = local_20;
          std::__cxx11::ostringstream::str();
          cmExecutionStatus::SetError(pcVar1,(string *)&__range3);
          std::__cxx11::string::~string((string *)&__range3);
          args_local._7_1_ = 0;
          fname.field_2._12_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8b0);
        }
        else {
          ppVar10 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>
                    ::operator->(&local_730);
          setMap = (cmExportSetMap *)&ppVar10->second;
LAB_0039eb14:
          pcVar12 = cmGlobalGenerator::GetExportedTargetsFile(this_00,(string *)local_308);
          if ((pcVar12 != (cmExportBuildFileGenerator *)0x0) &&
             (PVar4 = cmMakefile::GetPolicyStatus(pcVar8,CMP0103,false), pcVar1 = local_20,
             PVar4 != OLD)) {
            if (PVar4 != WARN) {
              cmAlphaNum::cmAlphaNum(&local_d88,"command already specified for the file\n  ");
              cmAlphaNum::cmAlphaNum
                        ((cmAlphaNum *)&ebfg,(string *)((long)&arguments.Namespace.field_2 + 8));
              cmStrCat<char[32]>(&local_d58,&local_d88,(cmAlphaNum *)&ebfg,
                                 (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
              cmExecutionStatus::SetError(pcVar1,&local_d58);
              std::__cxx11::string::~string((string *)&local_d58);
              args_local._7_1_ = 0;
              fname.field_2._12_4_ = 1;
              goto LAB_0039f08a;
            }
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_d08,(cmPolicies *)0x67,id);
            cmAlphaNum::cmAlphaNum(&local_ce8,&local_d08);
            cmAlphaNum::cmAlphaNum(&local_d38,'\n');
            cmStrCat<char[51],std::__cxx11::string,char[32]>
                      (&local_cb8,&local_ce8,&local_d38,
                       (char (*) [51])"export() command already specified for the file\n  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&arguments.Namespace.field_2 + 8),
                       (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
            cmMakefile::IssueMessage(pcVar8,AUTHOR_WARNING,&local_cb8);
            std::__cxx11::string::~string((string *)&local_cb8);
            std::__cxx11::string::~string((string *)&local_d08);
          }
          std::
          unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>::
          unique_ptr<std::default_delete<cmExportBuildFileGenerator>,void>
                    ((unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>
                      *)&local_dc0,(nullptr_t)0x0);
          if ((local_309 & 1) == 0) {
            std::make_unique<cmExportBuildFileGenerator>();
            std::
            unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
            ::operator=(&local_dc0,&local_dd0);
            std::
            unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
            ::~unique_ptr(&local_dd0);
          }
          else {
            std::make_unique<cmExportBuildAndroidMKGenerator>();
            std::
            unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>::
            operator=((unique_ptr<cmExportBuildFileGenerator,std::default_delete<cmExportBuildFileGenerator>>
                       *)&local_dc0,&local_dc8);
            std::
            unique_ptr<cmExportBuildAndroidMKGenerator,_std::default_delete<cmExportBuildAndroidMKGenerator>_>
            ::~unique_ptr(&local_dc8);
          }
          pcVar13 = std::
                    unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                    ::operator->(&local_dc0);
          mainFile = (char *)std::__cxx11::string::c_str();
          cmExportFileGenerator::SetExportFile(&pcVar13->super_cmExportFileGenerator,mainFile);
          pcVar13 = std::
                    unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                    ::operator->(&local_dc0);
          cmExportFileGenerator::SetNamespace
                    (&pcVar13->super_cmExportFileGenerator,
                     (string *)
                     &arguments.Targets.
                      super__Optional_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_engaged);
          pcVar13 = std::
                    unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                    ::operator->(&local_dc0);
          std::__cxx11::string::string
                    ((string *)
                     &configurationTypes.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (string *)(arguments.AndroidMKFile.field_2._M_local_buf + 8));
          cmExportBuildFileGenerator::SetCxxModuleDirectory
                    (pcVar13,(string *)
                             &configurationTypes.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string
                    ((string *)
                     &configurationTypes.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pcVar13 = std::
                    unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                    ::operator->(&local_dc0);
          cmExportBuildFileGenerator::SetAppendMode
                    (pcVar13,(bool)(arguments.CxxModulesDirectory.field_2._M_local_buf[8] & 1));
          if (setMap == (cmExportSetMap *)0x0) {
            pcVar13 = std::
                      unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                      ::operator->(&local_dc0);
            cmExportBuildFileGenerator::SetTargets
                      (pcVar13,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&gg);
          }
          else {
            pcVar13 = std::
                      unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                      ::operator->(&local_dc0);
            cmExportBuildFileGenerator::SetExportSet(pcVar13,(cmExportSet *)setMap);
          }
          pcVar13 = std::
                    unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                    ::operator->(&local_dc0);
          cmExportFileGenerator::SetExportOld
                    (&pcVar13->super_cmExportFileGenerator,
                     (bool)(arguments.CxxModulesDirectory.field_2._M_local_buf[9] & 1));
          cmMakefile::GetGeneratorConfigs_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1,pcVar8,IncludeEmptyConfig);
          __end1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range1);
          ct = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&ct), bVar2) {
            local_e28 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end1);
            pcVar13 = std::
                      unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                      ::operator->(&local_dc0);
            cmExportFileGenerator::AddConfiguration(&pcVar13->super_cmExportFileGenerator,local_e28)
            ;
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end1);
          }
          if (setMap == (cmExportSetMap *)0x0) {
            pcVar13 = std::
                      unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                      ::get(&local_dc0);
            cmGlobalGenerator::AddBuildExportSet(this_00,pcVar13);
          }
          else {
            pcVar13 = std::
                      unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                      ::get(&local_dc0);
            cmGlobalGenerator::AddBuildExportExportSet(this_00,pcVar13);
          }
          std::
          unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>::
          unique_ptr(&local_e30,&local_dc0);
          cmMakefile::AddExportBuildFileGenerator(pcVar8,&local_e30);
          std::
          unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>::
          ~unique_ptr(&local_e30);
          args_local._7_1_ = 1;
          fname.field_2._12_4_ = 1;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1);
          std::
          unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>::
          ~unique_ptr(&local_dc0);
        }
      }
      else {
        bVar2 = std::optional::operator_cast_to_bool
                          ((optional *)(arguments.ExportSetName.field_2._M_local_buf + 8));
        pcVar1 = local_20;
        if (bVar2) {
          this_01 = &std::
                     optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator*((optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  *)((long)&arguments.ExportSetName.field_2 + 8))->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ;
          __end3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(this_01);
          currentTarget =
               (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(this_01);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&currentTarget), bVar2) {
            name = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
            bVar2 = cmMakefile::IsAlias(pcVar8,name);
            if (bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a68);
              poVar11 = std::operator<<((ostream *)local_a68,"given ALIAS target \"");
              poVar11 = std::operator<<(poVar11,(string *)name);
              std::operator<<(poVar11,"\" which may not be exported.");
              pcVar1 = local_20;
              std::__cxx11::ostringstream::str();
              cmExecutionStatus::SetError(pcVar1,(string *)&target);
              std::__cxx11::string::~string((string *)&target);
              args_local._7_1_ = 0;
              fname.field_2._12_4_ = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a68);
              goto LAB_0039f08a;
            }
            local_a90 = cmGlobalGenerator::FindTarget(this_00,name,false);
            if (local_a90 == (cmTarget *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c48);
              poVar11 = std::operator<<((ostream *)local_c48,"given target \"");
              poVar11 = std::operator<<(poVar11,(string *)name);
              std::operator<<(poVar11,"\" which is not built by this project.");
              pcVar1 = local_20;
              std::__cxx11::ostringstream::str();
              cmExecutionStatus::SetError(pcVar1,(string *)&ebfg_1);
              std::__cxx11::string::~string((string *)&ebfg_1);
              args_local._7_1_ = 0;
              fname.field_2._12_4_ = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c48);
              goto LAB_0039f08a;
            }
            TVar3 = cmTarget::GetType(local_a90);
            pcVar1 = local_20;
            if (TVar3 == UTILITY) {
              std::operator+(&local_ad0,"given custom target \"",name);
              std::operator+(&local_ab0,&local_ad0,"\" which may not be exported.");
              cmExecutionStatus::SetError(pcVar1,&local_ab0);
              std::__cxx11::string::~string((string *)&local_ab0);
              std::__cxx11::string::~string((string *)&local_ad0);
              args_local._7_1_ = 0;
              fname.field_2._12_4_ = 1;
              goto LAB_0039f08a;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gg,name);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end3);
          }
          if (((arguments.CxxModulesDirectory.field_2._M_local_buf[8] & 1U) == 0) ||
             (local_c70 = cmGlobalGenerator::GetExportedTargetsFile(this_00,(string *)local_308),
             local_c70 == (cmExportBuildFileGenerator *)0x0)) goto LAB_0039eb14;
          cmExportBuildFileGenerator::AppendTargets
                    (local_c70,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&gg);
          args_local._7_1_ = 1;
          fname.field_2._12_4_ = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c90,"EXPORT or TARGETS specifier missing.",&local_c91);
          cmExecutionStatus::SetError(pcVar1,&local_c90);
          std::__cxx11::string::~string((string *)&local_c90);
          std::allocator<char>::~allocator(&local_c91);
          args_local._7_1_ = 0;
          fname.field_2._12_4_ = 1;
        }
      }
LAB_0039f08a:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gg);
    }
    else {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,0);
      bVar2 = std::operator!=(pvVar6,"EXPORT");
      pcVar1 = local_20;
      if (!bVar2) {
        std::operator+(&local_358,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2a0,".cmake");
        std::__cxx11::string::operator=((string *)local_308,(string *)&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        goto LAB_0039e20c;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"FILE <filename> option missing.",&local_331);
      cmExecutionStatus::SetError(pcVar1,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::allocator<char>::~allocator(&local_331);
      args_local._7_1_ = 0;
      fname.field_2._12_4_ = 1;
    }
LAB_0039f0a6:
    std::__cxx11::string::~string((string *)local_308);
  }
  else {
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&arguments.Append);
    std::operator+(&local_2e0,"Unknown argument: \"",__rhs);
    std::operator+(&local_2c0,&local_2e0,"\".");
    cmExecutionStatus::SetError(pcVar1,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    args_local._7_1_ = 0;
    fname.field_2._12_4_ = 1;
  }
  cmExportCommand::Arguments::~Arguments((Arguments *)local_2a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&arguments.Append);
  cmArgumentParser<Arguments>::~cmArgumentParser((cmArgumentParser<Arguments> *)local_c8);
LAB_0039f10e:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmExportCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return HandlePackage(args, status);
  }

  struct Arguments
  {
    std::string ExportSetName;
    cm::optional<ArgumentParser::MaybeEmpty<std::vector<std::string>>> Targets;
    std::string Namespace;
    std::string Filename;
    std::string AndroidMKFile;
    std::string CxxModulesDirectory;
    bool Append = false;
    bool ExportOld = false;
  };

  auto parser = cmArgumentParser<Arguments>{}
                  .Bind("NAMESPACE"_s, &Arguments::Namespace)
                  .Bind("FILE"_s, &Arguments::Filename);

  bool const supportCxx20FileSetTypes = cmExperimental::HasSupportEnabled(
    status.GetMakefile(), cmExperimental::Feature::CxxModuleCMakeApi);
  if (supportCxx20FileSetTypes) {
    parser.Bind("CXX_MODULES_DIRECTORY"_s, &Arguments::CxxModulesDirectory);
  }

  if (args[0] == "EXPORT") {
    parser.Bind("EXPORT"_s, &Arguments::ExportSetName);
  } else {
    parser.Bind("TARGETS"_s, &Arguments::Targets);
    parser.Bind("ANDROID_MK"_s, &Arguments::AndroidMKFile);
    parser.Bind("APPEND"_s, &Arguments::Append);
    parser.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, &Arguments::ExportOld);
  }

  std::vector<std::string> unknownArgs;
  Arguments const arguments = parser.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
    return false;
  }

  std::string fname;
  bool android = false;
  if (!arguments.AndroidMKFile.empty()) {
    fname = arguments.AndroidMKFile;
    android = true;
  }
  if (arguments.Filename.empty() && fname.empty()) {
    if (args[0] != "EXPORT") {
      status.SetError("FILE <filename> option missing.");
      return false;
    }
    fname = arguments.ExportSetName + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(arguments.Filename) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << arguments.Filename
        << "\" which does not have an extension of \".cmake\".\n";
      status.SetError(e.str());
      return false;
    }
    fname = arguments.Filename;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!mf.CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      status.SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string const& dir = mf.GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<std::string> targets;

  cmGlobalGenerator* gg = mf.GetGlobalGenerator();

  cmExportSet* exportSet = nullptr;
  if (args[0] == "EXPORT") {
    cmExportSetMap& setMap = gg->GetExportSets();
    auto const it = setMap.find(arguments.ExportSetName);
    if (it == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << arguments.ExportSetName << "\" not found.";
      status.SetError(e.str());
      return false;
    }
    exportSet = &it->second;
  } else if (arguments.Targets) {
    for (std::string const& currentTarget : *arguments.Targets) {
      if (mf.IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        status.SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          status.SetError("given custom target \"" + currentTarget +
                          "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        status.SetError(e.str());
        return false;
      }
      targets.push_back(currentTarget);
    }
    if (arguments.Append) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    status.SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // if cmExportBuildFileGenerator is already defined for the file
  // and APPEND is not specified, if CMP0103 is OLD ignore previous definition
  // else raise an error
  if (gg->GetExportedTargetsFile(fname) != nullptr) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0103)) {
      case cmPolicies::WARN:
        mf.IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0103), '\n',
                   "export() command already specified for the file\n  ",
                   arguments.Filename, "\nDid you miss 'APPEND' keyword?"));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      default:
        status.SetError(cmStrCat("command already specified for the file\n  ",
                                 arguments.Filename,
                                 "\nDid you miss 'APPEND' keyword?"));
        return false;
    }
  }

  // Setup export file generation.
  std::unique_ptr<cmExportBuildFileGenerator> ebfg = nullptr;
  if (android) {
    ebfg = cm::make_unique<cmExportBuildAndroidMKGenerator>();
  } else {
    ebfg = cm::make_unique<cmExportBuildFileGenerator>();
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(arguments.Namespace);
  ebfg->SetCxxModuleDirectory(arguments.CxxModulesDirectory);
  ebfg->SetAppendMode(arguments.Append);
  if (exportSet != nullptr) {
    ebfg->SetExportSet(exportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  ebfg->SetExportOld(arguments.ExportOld);

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes =
    mf.GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (exportSet != nullptr) {
    gg->AddBuildExportExportSet(ebfg.get());
  } else {
    gg->AddBuildExportSet(ebfg.get());
  }
  mf.AddExportBuildFileGenerator(std::move(ebfg));

  return true;
}